

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O3

bool dxil_spv::emit_ray_query_abort_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Value *operand;
  Operation *this;
  Id ray_object_id;
  Id local_1c;
  
  local_1c = 0;
  operand = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  bVar1 = build_ray_query_object(impl,operand,&local_1c,(uint32_t *)0x0);
  if (bVar1) {
    this = Converter::Impl::allocate(impl,OpRayQueryTerminateKHR);
    Operation::add_id(this,local_1c);
    Converter::Impl::add(impl,this,false);
  }
  return bVar1;
}

Assistant:

bool emit_ray_query_abort_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	spv::Id ray_object_id = 0;
	if (!build_ray_query_object(impl, instruction->getOperand(1), ray_object_id))
		return false;

	auto *op = impl.allocate(spv::OpRayQueryTerminateKHR);
	op->add_id(ray_object_id);
	impl.add(op);
	return true;
}